

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfttest.cc
# Opt level: O2

void test::perft::testPosition(string *token,Board *pos)

{
  int64_t __val;
  ostream *poVar1;
  int iVar2;
  char *in_R9;
  AssertHelper AStack_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  string local_68;
  AssertionResult gtest_ar_;
  string target;
  
  iVar2 = (token->_M_dataplus)._M_p[1] + -0x30;
  std::__cxx11::string::find((char)token,0x20);
  std::__cxx11::string::substr((ulong)&target,(ulong)token);
  __val = countMoves(iVar2,pos);
  utils::getTimestamp_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_68);
  poVar1 = std::operator<<(poVar1," D");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::to_string(&local_68,__val);
  iVar2 = std::__cxx11::string::compare((string *)&target);
  gtest_ar_.success_ = iVar2 == 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&local_68);
  if (iVar2 != 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&gtest_ar_,
               (AssertionResult *)"target.compare(std::to_string(nodes)) == 0","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sneivandt[P]chess/test/perfttest/perfttest.cc"
               ,0x3b,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&AStack_78);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&target);
  return;
}

Assistant:

void test::perft::testPosition(const std::string& token, board::Board& pos)
{
    int depth = token[1] - '0';
    std::string target = token.substr(token.find(' ') + 1, token.length());
    int64_t nodes = countMoves(depth, pos);
    std::cout << utils::getTimestamp() << " D" << depth << " " << nodes << std::endl;
    ASSERT_TRUE(target.compare(std::to_string(nodes)) == 0);
}